

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

logic_t __thiscall slang::SVInt::reductionAnd(SVInt *this)

{
  ulong *puVar1;
  uint64_t *puVar2;
  bool bVar3;
  uint64_t *puVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t i_1;
  ulong uVar9;
  
  uVar6 = (this->super_SVIntStorage).bitWidth;
  uVar8 = -(ulong)((uVar6 & 0x3f) == 0) | ~(-1L << (sbyte)(uVar6 & 0x3f));
  bVar3 = (this->super_SVIntStorage).unknownFlag;
  if (bVar3 == true) {
    uVar6 = uVar6 + 0x3f >> 6;
    puVar4 = (this->super_SVIntStorage).field_0.pVal;
    uVar9 = 0;
    do {
      if (uVar6 - 1 == uVar9) {
        return (logic_t)(((puVar4[uVar6 * 2 - 1] | puVar4[uVar6 - 1]) == uVar8) << 7);
      }
      iVar5 = (int)uVar9;
      puVar1 = puVar4 + uVar9;
      uVar9 = uVar9 + 1;
    } while ((puVar4[uVar6 + iVar5] | *puVar1) == 0xffffffffffffffff);
  }
  else {
    if (uVar6 < 0x41) {
      uVar9 = (this->super_SVIntStorage).field_0.val;
LAB_001aaebb:
      return (logic_t)(uVar9 == uVar8);
    }
    uVar7 = (ulong)(((uVar6 + 0x3f >> 6) << (bVar3 & 0x1fU)) - 1);
    puVar4 = (this->super_SVIntStorage).field_0.pVal;
    uVar9 = 0;
    do {
      if (uVar7 == uVar9) {
        uVar9 = puVar4[uVar7];
        goto LAB_001aaebb;
      }
      puVar2 = puVar4 + uVar9;
      uVar9 = uVar9 + 1;
    } while (*puVar2 == 0xffffffffffffffff);
  }
  return (logic_t)'\0';
}

Assistant:

logic_t SVInt::reductionAnd() const {
    uint64_t mask;
    bitwidth_t bitsInMsw;
    getTopWordMask(bitsInMsw, mask);

    if (unknownFlag) {
        uint32_t words = getNumWords(bitWidth, false);
        for (uint32_t i = 0; i < words - 1; i++) {
            if ((pVal[i] | pVal[i + words]) != UINT64_MAX)
                return logic_t(false);
        }
        if ((pVal[words - 1] | pVal[words * 2 - 1]) != mask)
            return logic_t(false);
        return logic_t::x;
    }

    if (isSingleWord())
        return logic_t(val == mask);
    else {
        for (uint32_t i = 0; i < getNumWords() - 1; i++) {
            if (pVal[i] != UINT64_MAX)
                return logic_t(false);
        }
        return logic_t(pVal[getNumWords() - 1] == mask);
    }
}